

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseXMLDocument(TidyDocImpl *doc)

{
  Bool BVar1;
  Node *node_00;
  Node *local_20;
  Node *doctype;
  Node *node;
  TidyDocImpl *doc_local;
  
  local_20 = (Node *)0x0;
  prvTidySetOptionBool(doc,TidyXmlTags,yes);
  doc->xmlDetected = yes;
  while (node_00 = prvTidyGetToken(doc,IgnoreWhitespace), node_00 != (Node *)0x0) {
    if (node_00->type == EndTag) {
      prvTidyReport(doc,(Node *)0x0,node_00,0x287);
      prvTidyFreeNode(doc,node_00);
    }
    else {
      BVar1 = InsertMisc(&doc->root,node_00);
      if (BVar1 == no) {
        if (node_00->type == DocTypeTag) {
          if (local_20 == (Node *)0x0) {
            prvTidyInsertNodeAtEnd(&doc->root,node_00);
            local_20 = node_00;
          }
          else {
            prvTidyReport(doc,&doc->root,node_00,0x235);
            prvTidyFreeNode(doc,node_00);
          }
        }
        else if (node_00->type == StartEndTag) {
          prvTidyInsertNodeAtEnd(&doc->root,node_00);
        }
        else if (node_00->type == StartTag) {
          prvTidyInsertNodeAtEnd(&doc->root,node_00);
          ParseHTMLWithNode(doc,node_00);
        }
        else {
          prvTidyReport(doc,&doc->root,node_00,0x235);
          prvTidyFreeNode(doc,node_00);
        }
      }
    }
  }
  if ((int)(doc->config).value[99].v != 0) {
    prvTidyFixXmlDecl(doc);
  }
  return;
}

Assistant:

void TY_(ParseXMLDocument)(TidyDocImpl* doc)
{
    Node *node, *doctype = NULL;

    TY_(SetOptionBool)( doc, TidyXmlTags, yes );

    doc->xmlDetected = yes;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            TY_(Report)(doc, NULL, node, UNEXPECTED_ENDTAG);
            TY_(FreeNode)( doc, node);
            continue;
        }

         /* deal with comments etc. */
        if (InsertMisc( &doc->root, node))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == StartEndTag)
        {
            TY_(InsertNodeAtEnd)( &doc->root, node);
            continue;
        }

       /* if start tag then parse element's content */
        if (node->type == StartTag)
        {
            TY_(InsertNodeAtEnd)( &doc->root, node );
            ParseHTMLWithNode( doc, node );
            continue;
        }

        TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    /* ensure presence of initial <?xml version="1.0"?> */
    if ( cfgBool(doc, TidyXmlDecl) )
        TY_(FixXmlDecl)( doc );
}